

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

void __thiscall llama_context::kv_self_update(llama_context *this)

{
  uint32_t uVar1;
  bool bVar2;
  uint uVar3;
  llama_ubatch *ubatch_00;
  pointer plVar4;
  pointer pgVar5;
  ggml_cgraph *pgVar6;
  pointer plVar7;
  reference pvVar8;
  ulong uVar9;
  ggml_cgraph *in_RDI;
  ggml_context *unaff_retaddr;
  llama_context *in_stack_00000008;
  ggml_cgraph *gf_2;
  llama_ubatch ubatch;
  llama_token token;
  uint32_t n_tokens;
  uint32_t n_seqs;
  llm_graph_result_ptr res_1;
  ggml_cgraph *gf_1;
  uint32_t i;
  llm_graph_result_ptr res;
  ggml_cgraph *gf;
  bool need_reserve;
  unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_> *kv;
  ggml_cgraph *in_stack_00000178;
  ggml_context *in_stack_00000180;
  llama_context *in_stack_00000188;
  llama_context *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  llama_context *in_stack_ffffffffffffff80;
  undefined1 batched;
  ggml_cgraph *in_stack_ffffffffffffff88;
  llama_context *in_stack_ffffffffffffff90;
  uint local_38;
  int32_t in_stack_ffffffffffffffd4;
  llama_kv_cache_unified *in_stack_ffffffffffffffd8;
  uint3 in_stack_ffffffffffffffec;
  llm_graph_type gtype;
  ggml_cgraph *gf_00;
  
  ubatch_00 = (llama_ubatch *)(in_RDI + 0x220);
  gtype = (llm_graph_type)in_stack_ffffffffffffffec;
  gf_00 = in_RDI;
  plVar4 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
           operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                       *)0x3dac5f);
  if ((plVar4->has_shift & 1U) != 0) {
    plVar4 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
             operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                         *)0x3dac76);
    uVar3 = (*(plVar4->super_llama_kv_cache).super_llama_memory_i._vptr_llama_memory_i[0xd])();
    if ((uVar3 & 1) == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                 ,0x2ec,"The current context does not support K-shift");
    }
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: applying K-shift\n","kv_self_update");
    if (*(int *)(*(long *)in_RDI + 0x1950) != -1) {
      pgVar5 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                         ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)
                          in_stack_ffffffffffffff30);
      ggml_backend_sched_reset(pgVar5);
      pgVar6 = graph_init(in_stack_ffffffffffffff80);
      std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                ((unique_ptr<ggml_context,_ggml_context_deleter> *)in_stack_ffffffffffffff30);
      build_kv_self_shift((llama_context *)gf_1,
                          (ggml_context *)
                          res_1._M_t.
                          super___uniq_ptr_impl<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llm_graph_result_i_*,_std::default_delete<llm_graph_result_i>_>
                          .super__Head_base<0UL,_llm_graph_result_i_*,_false>._M_head_impl,_n_tokens
                         );
      pgVar5 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                         ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)
                          in_stack_ffffffffffffff30);
      ggml_backend_sched_alloc_graph(pgVar5,pgVar6);
      plVar7 = std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::
               operator->((unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>
                           *)0x3dad53);
      (*plVar7->_vptr_llm_graph_result_i[5])(plVar7,0);
      graph_compute(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                    SUB81((ulong)in_stack_ffffffffffffff80 >> 0x38,0));
      gtype = CONCAT13(1,(int3)gtype);
      std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::~unique_ptr
                ((unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    }
    plVar4 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
             operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                         *)0x3dadc5);
    plVar4->has_shift = false;
    local_38 = 0;
    while (in_stack_ffffffffffffff44 = local_38,
          plVar4 = std::
                   unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                   ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                 *)0x3dadec), in_stack_ffffffffffffff44 < plVar4->size) {
      plVar4 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
               ::operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                             *)0x3dae05);
      pvVar8 = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                         (&plVar4->cells,(ulong)local_38);
      pvVar8->delta = 0;
      local_38 = local_38 + 1;
    }
  }
  plVar4 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
           operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                       *)0x3dae43);
  if ((plVar4->do_defrag & 1U) != 0) {
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: defragmenting KV cache\n","kv_self_update");
    std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
    operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_> *)
               0x3dae74);
    graph_max_nodes(in_stack_ffffffffffffff30);
    bVar2 = llama_kv_cache_unified::defrag_prepare
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    if (bVar2) {
      in_stack_ffffffffffffff30 = (llama_context *)(in_RDI + 0x2a0);
      pgVar5 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                         ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)
                          in_stack_ffffffffffffff30);
      ggml_backend_sched_reset(pgVar5);
      pgVar6 = graph_init(in_stack_ffffffffffffff80);
      batched = (undefined1)((ulong)in_stack_ffffffffffffff80 >> 0x38);
      std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                ((unique_ptr<ggml_context,_ggml_context_deleter> *)in_stack_ffffffffffffff30);
      build_kv_self_defrag(in_stack_00000188,in_stack_00000180,in_stack_00000178);
      pgVar5 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                         ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)
                          in_stack_ffffffffffffff30);
      ggml_backend_sched_alloc_graph(pgVar5,pgVar6);
      plVar7 = std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::
               operator->((unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>
                           *)0x3daf1f);
      (*plVar7->_vptr_llm_graph_result_i[5])(plVar7,0);
      graph_compute(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(bool)batched);
      gtype = CONCAT13(1,(int3)gtype);
      std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::~unique_ptr
                ((unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    }
    plVar4 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
             operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                         *)0x3daf91);
    plVar4->do_defrag = false;
  }
  if ((gtype & 0x1000000) != LLM_GRAPH_TYPE_DEFAULT) {
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: reserving a worst case graph\n","kv_self_update");
    std::min<unsigned_int>((uint *)(in_RDI + 8),(uint *)(in_RDI + 0x10));
    plVar4 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
             operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                         *)0x3daffb);
    uVar1 = plVar4->size;
    plVar4 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
             operator->((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                         *)0x3db013);
    plVar4->n = uVar1;
    llama_vocab::token_bos((llama_vocab *)0x3db031);
    pgVar6 = graph_init((llama_context *)0x0);
    std::unique_ptr<ggml_context,_ggml_context_deleter>::get
              ((unique_ptr<ggml_context,_ggml_context_deleter> *)in_stack_ffffffffffffff30);
    graph_build(in_stack_00000008,unaff_retaddr,gf_00,ubatch_00,gtype);
    std::unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_>::~unique_ptr
              ((unique_ptr<llm_graph_result_i,_std::default_delete<llm_graph_result_i>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    pgVar5 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                       ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)
                        in_stack_ffffffffffffff30);
    ggml_backend_sched_reset(pgVar5);
    pgVar5 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                       ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)
                        in_stack_ffffffffffffff30);
    uVar9 = ggml_backend_sched_reserve(pgVar5,pgVar6);
    if ((uVar9 & 1) == 0) {
      llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate compute buffers\n",
                         "kv_self_update");
    }
  }
  return;
}

Assistant:

void llama_context::kv_self_update() {
    auto & kv = kv_self;

    bool need_reserve = false;

    if (kv->has_shift) {
        if (!kv->get_can_shift()) {
            GGML_ABORT("The current context does not support K-shift");
        }

        LLAMA_LOG_DEBUG("%s: applying K-shift\n", __func__);

        // apply K-shift if needed
        if (model.hparams.rope_type != LLAMA_ROPE_TYPE_NONE) {
            ggml_backend_sched_reset(sched.get());

            auto * gf = graph_init();

            auto res = build_kv_self_shift(ctx_compute.get(), gf);

            ggml_backend_sched_alloc_graph(sched.get(), gf);

            res->set_inputs(nullptr);

            graph_compute(gf, false);

            need_reserve = true;
        }

        {
            kv->has_shift = false;

            for (uint32_t i = 0; i < kv->size; ++i) {
                kv->cells[i].delta = 0;
            }
        }
    }

    // defragment the KV cache if needed
    if (kv->do_defrag) {
        LLAMA_LOG_DEBUG("%s: defragmenting KV cache\n", __func__);

        if (kv->defrag_prepare(graph_max_nodes())) {
            ggml_backend_sched_reset(sched.get());

            auto * gf = graph_init();

            auto res = build_kv_self_defrag(ctx_compute.get(), gf);

            ggml_backend_sched_alloc_graph(sched.get(), gf);

            res->set_inputs(nullptr);

            graph_compute(gf, false);

            need_reserve = true;
        }

        kv->do_defrag = false;
    }

    // reserve a worst case graph if needed
    if (need_reserve) {
        LLAMA_LOG_DEBUG("%s: reserving a worst case graph\n", __func__);

        // build worst-case graph
        uint32_t n_seqs = 1; // TODO: worst-case number of sequences
        uint32_t n_tokens = std::min(cparams.n_ctx, cparams.n_ubatch);

        // simulate full KV cache
        kv_self->n = kv_self->size;

        llama_token token = model.vocab.token_bos(); // not actually used by llama_build_graph, but required to choose between token and embedding inputs graph
        llama_ubatch ubatch = { true, n_tokens, n_tokens / n_seqs, n_seqs, &token, nullptr, nullptr, nullptr, nullptr, nullptr};

        auto * gf = graph_init();
        graph_build(ctx_compute.get(), gf, ubatch, LLM_GRAPH_TYPE_DEFAULT);

        // initialize scheduler with the worst-case graph
        ggml_backend_sched_reset(sched.get());
        if (!ggml_backend_sched_reserve(sched.get(), gf)) {
            LLAMA_LOG_ERROR("%s: failed to allocate compute buffers\n", __func__);
        }
    }
}